

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.h
# Opt level: O2

STBlob * __thiscall
jbcoin::STObject::getFieldByConstRef<jbcoin::STBlob,jbcoin::STBlob>
          (STObject *this,SField *field,STBlob *empty)

{
  int iVar1;
  STBase *pSVar2;
  
  pSVar2 = peekAtPField(this,field);
  if (pSVar2 == (STBase *)0x0) {
    Throw<std::runtime_error,char_const(&)[16]>((char (*) [16])"Field not found");
  }
  iVar1 = (*pSVar2->_vptr_STBase[4])(pSVar2);
  if (iVar1 != 0) {
    empty = (STBlob *)__dynamic_cast(pSVar2,&STBase::typeinfo,&STBlob::typeinfo,0);
    if (empty == (STBlob *)0x0) {
      Throw<std::runtime_error,char_const(&)[17]>((char (*) [17])"Wrong field type");
    }
  }
  return empty;
}

Assistant:

V const& getFieldByConstRef (SField const& field, V const& empty) const
    {
        const STBase* rf = peekAtPField (field);

        if (! rf)
            Throw<std::runtime_error> ("Field not found");

        SerializedTypeID id = rf->getSType ();

        if (id == STI_NOTPRESENT)
            return empty; // optional field not present

        const T* cf = dynamic_cast<const T*> (rf);

        if (! cf)
            Throw<std::runtime_error> ("Wrong field type");

        return *cf;
    }